

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O2

void cnn::TensorTools::CopyElements(Tensor *v,Tensor *v_src)

{
  float *__dest;
  float *__src;
  uint uVar1;
  
  __dest = v->v;
  __src = v_src->v;
  uVar1 = Dim::size(&v->d);
  memcpy(__dest,__src,(ulong)uVar1 << 2);
  return;
}

Assistant:

void TensorTools::CopyElements(const Tensor& v, const Tensor& v_src) {
#if HAVE_CUDA
  cudaMemcpyAsync(v.v, v_src.v, sizeof(real) * v.d.size(), cudaMemcpyDeviceToDevice);
#else
  memcpy(v.v, v_src.v, sizeof(real) * v.d.size());
#endif
}